

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimdInt32x4OperationX86X64.cpp
# Opt level: O0

SIMDValue Js::SIMDInt32x4Operation::OpMul(SIMDValue *aValue,SIMDValue *bValue)

{
  _x86_SIMDValue _Var1;
  _x86_SIMDValue _Var2;
  anon_union_16_9_4d7543c8_for__SIMDValue_0 aVar3;
  int iStack_d8;
  __m128i tmp2;
  __m128i tmp1;
  X86SIMDValue tmpbValue;
  X86SIMDValue tmpaValue;
  X86SIMDValue x86Result;
  SIMDValue *bValue_local;
  SIMDValue *aValue_local;
  SIMDValue result;
  
  _Var1 = _x86_SIMDValue::ToX86SIMDValue(aValue);
  _Var2 = _x86_SIMDValue::ToX86SIMDValue(bValue);
  tmp2[1]._0_4_ = _Var1.field_0._0_4_ * _Var2.field_0._0_4_;
  result.field_0.i32[2] = _Var2.field_0._4_4_;
  iStack_d8 = _Var1.field_0._4_4_ * result.field_0.i32[2];
  tmpaValue.field_0.i32[2] = (int)tmp2[1];
  tmpaValue.field_0.i32[3] = iStack_d8;
  aVar3 = (anon_union_16_9_4d7543c8_for__SIMDValue_0)
          _x86_SIMDValue::ToSIMDValue((_x86_SIMDValue *)((long)&tmpaValue.field_0 + 8));
  return (SIMDValue)aVar3;
}

Assistant:

SIMDValue SIMDInt32x4Operation::OpMul(const SIMDValue& aValue, const SIMDValue& bValue)
    {
        SIMDValue result;
        X86SIMDValue x86Result;
        X86SIMDValue tmpaValue = X86SIMDValue::ToX86SIMDValue(aValue);
        X86SIMDValue tmpbValue = X86SIMDValue::ToX86SIMDValue(bValue);

        // a * b, only available in SSE4
        // x86Result.m128i_value = _mm_mullo_epi32(tmpaValue.m128i_value, tmpbValue.m128i_value);
        // result = X86SIMDValue::ToSIMDValue(x86Result);

        // SSE2
        // mul 2,0: r0 = a0*b0; r1 = a2*b2
        __m128i tmp1 = _mm_mul_epu32(tmpaValue.m128i_value, tmpbValue.m128i_value);
        // mul 3,1: r0=a1*b1; r1=a3*b3
        __m128i tmp2 = _mm_mul_epu32(_mm_srli_si128(tmpaValue.m128i_value, 4), _mm_srli_si128(tmpbValue.m128i_value, 4));
        // shuffle x86Results to [63..0] and pack
        x86Result.m128i_value = _mm_unpacklo_epi32(_mm_shuffle_epi32(tmp1, _MM_SHUFFLE(0, 0, 2, 0)), _mm_shuffle_epi32(tmp2, _MM_SHUFFLE(0, 0, 2, 0)));
        result = X86SIMDValue::ToSIMDValue(x86Result);

        return result;
    }